

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O1

int lws_add_http_header_content_length(lws *wsi,lws_filepos_t content_length,uchar **p,uchar *end)

{
  int iVar1;
  char b [24];
  uchar auStack_48 [32];
  
  iVar1 = lws_snprintf((char *)auStack_48,0x17,"%llu",content_length);
  iVar1 = lws_add_http_header_by_token(wsi,WSI_TOKEN_HTTP_CONTENT_LENGTH,auStack_48,iVar1,p,end);
  if (iVar1 == 0) {
    (wsi->http).tx_content_length = content_length;
    (wsi->http).tx_content_remain = content_length;
    _lws_log(8,"%s: wsi %p: tx_content_length/remain %llu\n","lws_add_http_header_content_length",
             wsi,content_length);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int
lws_add_http_header_content_length(struct lws *wsi,
				   lws_filepos_t content_length,
				   unsigned char **p, unsigned char *end)
{
	char b[24];
	int n;

	n = lws_snprintf(b, sizeof(b) - 1, "%llu", (unsigned long long)content_length);
	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH,
					 (unsigned char *)b, n, p, end))
		return 1;
	wsi->http.tx_content_length = content_length;
	wsi->http.tx_content_remain = content_length;

	lwsl_info("%s: wsi %p: tx_content_length/remain %llu\n", __func__,
			wsi, (unsigned long long)content_length);

	return 0;
}